

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_ToIndex(JSContext *ctx,uint64_t *plen,JSValue val)

{
  int iVar1;
  uint64_t uVar2;
  int64_t v;
  
  iVar1 = JS_ToInt64Sat(ctx,&v,val);
  if (iVar1 == 0) {
    iVar1 = 0;
    uVar2 = v;
    if ((ulong)v >> 0x35 != 0) {
      uVar2 = 0;
      JS_ThrowRangeError(ctx,"invalid array index");
      iVar1 = -1;
    }
    *plen = uVar2;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int JS_ToIndex(JSContext *ctx, uint64_t *plen, JSValueConst val)
{
    int64_t v;
    if (JS_ToInt64Sat(ctx, &v, val))
        return -1;
    if (v < 0 || v > MAX_SAFE_INTEGER) {
        JS_ThrowRangeError(ctx, "invalid array index");
        *plen = 0;
        return -1;
    }
    *plen = v;
    return 0;
}